

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O3

void MIR_append_insn(MIR_context_t ctx,MIR_item_t_conflict func_item,MIR_insn_t_conflict insn)

{
  byte bVar1;
  VARR_MIR_proto_t *pVVar2;
  MIR_var_t *pMVar3;
  MIR_error_func_t p_Var4;
  size_t sVar5;
  MIR_proto_t *ppMVar6;
  MIR_proto_t pMVar7;
  undefined8 *puVar8;
  MIR_proto_t pMVar9;
  ulong extraout_RDX;
  ulong uVar10;
  char *pcVar11;
  size_t extraout_RDX_00;
  MIR_insn_code_t code;
  char *pcVar12;
  char *pcVar13;
  MIR_error_type_t MVar14;
  MIR_context_t ctx_00;
  MIR_proto_t pMVar15;
  long lVar17;
  long *unaff_R13;
  MIR_error_func_t p_Stack_38;
  ulong uVar16;
  
  if (func_item == (MIR_item_t_conflict)0x0) {
    __assert_fail("func_item != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                  ,0xa62,"void MIR_append_insn(MIR_context_t, MIR_item_t, MIR_insn_t)");
  }
  if (func_item->item_type == MIR_func_item) {
    DLIST_MIR_insn_t_append(&((func_item->u).func)->insns,insn);
    return;
  }
  pcVar12 = "MIR_append_insn: wrong func item";
  ctx_00 = (MIR_context_t)0xb;
  (*ctx->error_func)(MIR_wrong_param_value_error,"MIR_append_insn: wrong func item");
  code = (MIR_insn_code_t)pcVar12;
  sVar5 = insn_code_nops(ctx_00,code);
  if (ctx == (MIR_context_t)0x0 && extraout_RDX != 0) {
LAB_00133233:
    __assert_fail("nops == 0 || ops != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                  ,0x890,
                  "MIR_insn_t MIR_new_insn_arr(MIR_context_t, MIR_insn_code_t, size_t, MIR_op_t *)")
    ;
  }
  if (code - MIR_SWITCH < 0xfffffffd) {
    if ((int)code < 0xb5) {
      if (code == MIR_SWITCH) goto LAB_00132f3e;
      if (code != MIR_RET) goto LAB_00132f1f;
    }
    else if ((code != MIR_UNSPEC) && (code != MIR_USE)) {
      if (code != MIR_PHI) {
LAB_00132f1f:
        if (sVar5 != extraout_RDX) goto LAB_0013338c;
        goto LAB_00132f28;
      }
      goto LAB_00132fd6;
    }
LAB_00132f54:
    if ((int)code < 0xb0) {
      if (code - MIR_CALL < 3) {
LAB_00132f72:
        uVar10 = (ulong)(code != MIR_UNSPEC) + 1;
        if (extraout_RDX < uVar10) goto LAB_00133347;
        if (code == MIR_UNSPEC) {
          if (*(char *)&ctx->c2mir_ctx != '\x03') {
LAB_00133363:
            pcVar13 = "the 1st unspec operand should be valid unspec code";
            MVar14 = MIR_unspec_op_error;
            goto LAB_00133387;
          }
          pVVar2 = ctx_00->unspec_protos;
          if (pVVar2 == (VARR_MIR_proto_t *)0x0) {
            MIR_new_insn_arr_cold_6();
          }
          else {
            if ((MIR_error_func_t)pVVar2->els_num <= ctx->error_func) goto LAB_00133363;
            if (pVVar2->varr != (MIR_proto_t *)0x0) {
              ppMVar6 = pVVar2->varr + (long)ctx->error_func;
              goto LAB_0013306e;
            }
          }
          MIR_new_insn_arr_cold_5();
LAB_0013337b:
          pcVar13 = "property should be a integer operand";
LAB_00133382:
          MVar14 = MIR_op_mode_error;
          goto LAB_00133387;
        }
        if ((*(char *)&ctx->c2mir_ctx != '\b') || (*(int *)(ctx->error_func + 0x20) != 1)) {
          pcVar13 = "the 1st call operand should be a prototype";
          MVar14 = MIR_call_op_error;
          goto LAB_00133387;
        }
        ppMVar6 = (MIR_proto_t *)(ctx->error_func + 0x40);
LAB_0013306e:
        pMVar9 = *ppMVar6;
        pMVar7 = (MIR_proto_t)(ulong)pMVar9->nres;
        pcVar13 = (char *)pMVar9->args;
        pMVar15 = pMVar7;
        if ((VARR_MIR_var_t *)pcVar13 != (VARR_MIR_var_t *)0x0) {
          pMVar15 = (MIR_proto_t)((long)&pMVar7->name + ((VARR_MIR_var_t *)pcVar13)->els_num);
        }
        uVar16 = (long)&pMVar15->name + uVar10;
        if (extraout_RDX < uVar16) goto LAB_00133316;
        if ((uVar16 != extraout_RDX) && (pMVar9->vararg_p == '\0')) goto LAB_00133316;
        pMVar9 = (MIR_proto_t)(extraout_RDX - uVar10);
        if (uVar10 <= extraout_RDX && pMVar9 != (MIR_proto_t)0x0) {
          pMVar15 = (MIR_proto_t)0x0;
          unaff_R13 = (long *)((long)&ctx->unspec_protos + (ulong)(uint)((int)uVar10 * 0x30));
          lVar17 = (long)pMVar7 * -0x18;
          do {
            if (((char)unaff_R13[-4] == '\n') &&
               (bVar1 = *(byte *)(unaff_R13 + -3), 0xfffffff9 < bVar1 - 0x12)) {
              sVar5 = (long)pMVar15 - (long)pMVar7;
              if (pMVar15 < pMVar7) {
LAB_0013320d:
                pcVar13 = "result of %s is block type memory";
LAB_001332c0:
                pcVar11 = "call";
                if (code == MIR_UNSPEC) {
                  pcVar11 = "unspec";
                }
                MVar14 = MIR_wrong_type_error;
                goto LAB_001332c9;
              }
              if ((VARR_MIR_var_t *)pcVar13 == (VARR_MIR_var_t *)0x0) {
                MIR_new_insn_arr_cold_2();
                goto LAB_00133233;
              }
              if ((ulong)(-(long)pMVar7 + (long)pMVar15) < ((VARR_MIR_var_t *)pcVar13)->els_num) {
                pMVar3 = ((VARR_MIR_var_t *)pcVar13)->varr;
                if (pMVar3 == (MIR_var_t *)0x0) goto LAB_00133311;
                if (*(uint *)((long)&pMVar3->type + lVar17) != (uint)bVar1) {
                  pcVar13 = "arg of %s is block type memory but param is not of block type";
                  goto LAB_001332c0;
                }
                if (*(long *)((long)&pMVar3->size + lVar17) != *unaff_R13) goto LAB_001332ce;
              }
              else if (bVar1 == 0x11) {
LAB_00133286:
                pcVar13 = "RBLK memory can not correspond to unnamed param in %s insn";
                goto LAB_001332c0;
              }
            }
            else if (pMVar7 <= pMVar15) {
              if ((VARR_MIR_var_t *)pcVar13 == (VARR_MIR_var_t *)0x0) {
                MIR_new_insn_arr_cold_4();
                goto LAB_0013320d;
              }
              if ((ulong)(-(long)pMVar7 + (long)pMVar15) < ((VARR_MIR_var_t *)pcVar13)->els_num) {
                if (((VARR_MIR_var_t *)pcVar13)->varr == (MIR_var_t *)0x0) {
                  MIR_new_insn_arr_cold_3();
                  goto LAB_00133286;
                }
                if (0xfffffff9 <
                    *(int *)((long)&((VARR_MIR_var_t *)pcVar13)->varr->type + lVar17) - 0x12U) {
                  pcVar13 = "param of %s is of block type but arg is not of block type memory";
                  goto LAB_001332c0;
                }
              }
            }
            pMVar15 = (MIR_proto_t)((long)&pMVar15->name + 1);
            lVar17 = lVar17 + 0x18;
            unaff_R13 = unaff_R13 + 6;
          } while (pMVar9 != pMVar15);
        }
      }
      else {
LAB_00133013:
        if (code - MIR_PRBEQ < 2) {
          if (*(char *)&(ctx->environment_module).items.tail != '\x03') goto LAB_0013337b;
          if ((*(char *)&ctx->temp_data != '\x01') && (*(char *)&ctx->temp_data != '\n')) {
            pcVar13 = "2nd operand of property branch should be any memory or reg with given type";
            goto LAB_00133382;
          }
        }
      }
    }
    else if (code == MIR_VA_ARG) {
      if (*(char *)&(ctx->environment_module).items.tail != '\n') {
        pcVar13 = "3rd operand of va_arg should be any memory with given type";
        goto LAB_00133382;
      }
    }
    else {
      if (code != MIR_PRSET) {
        if (code != MIR_UNSPEC) goto LAB_00133013;
        goto LAB_00132f72;
      }
      if (*(char *)&ctx->temp_data != '\x03') goto LAB_0013337b;
    }
  }
  else {
LAB_00132f28:
    if (code == MIR_PHI) {
LAB_00132fd6:
      if (extraout_RDX < 3) {
        pcVar13 = "number of MIR_PHI operands is less 3";
        goto LAB_0013334e;
      }
    }
    else {
      if (code != MIR_SWITCH) goto LAB_00132f54;
LAB_00132f3e:
      if (extraout_RDX < 2) {
        pcVar13 = "number of MIR_SWITCH operands is less 2";
        goto LAB_0013334e;
      }
    }
  }
  puVar8 = (undefined8 *)malloc((extraout_RDX + (extraout_RDX == 0)) * 0x30 + 0x20);
  if (puVar8 != (undefined8 *)0x0) {
    *puVar8 = 0;
    puVar8[3] = extraout_RDX << 0x20 | (ulong)pcVar12 & 0xffffffff;
    if (extraout_RDX != 0) {
      memcpy(puVar8 + 4,ctx,extraout_RDX * 0x30);
    }
    return;
  }
  pcVar13 = "Not enough memory for insn creation";
  MVar14 = MIR_alloc_error;
LAB_00133387:
  do {
    (*ctx_00->error_func)(MVar14,pcVar13);
LAB_0013338c:
    pcVar13 = "wrong number of operands for insn %s";
    MVar14 = MIR_ops_num_error;
    pcVar11 = insn_descs[(ulong)pcVar12 & 0xffffffff].name;
LAB_001332c9:
    (*ctx_00->error_func)(MVar14,pcVar13,pcVar11);
    sVar5 = extraout_RDX_00;
LAB_001332ce:
    p_Var4 = ctx_00->error_func;
    ctx_00 = (MIR_context_t)&stack0xffffffffffffffb8;
    VARR_MIR_var_tget((MIR_var_t *)ctx_00,(VARR_MIR_var_t *)pcVar13,sVar5);
    pMVar9 = (MIR_proto_t)*unaff_R13;
    pcVar13 = "call";
    if (code == MIR_UNSPEC) {
      pcVar13 = "unspec";
    }
    (*p_Var4)(MIR_wrong_type_error,
              "different sizes (%lu vs %lu) of arg and param block memory in %s insn",p_Stack_38,
              pMVar9,pcVar13);
LAB_00133311:
    MIR_new_insn_arr_cold_1();
LAB_00133316:
    pcVar13 = "call";
    if (code == MIR_UNSPEC) {
      pcVar13 = "unspec";
    }
    (*ctx_00->error_func)
              (code == MIR_UNSPEC | MIR_call_op_error,
               "number of %s operands or results does not correspond to prototype %s",pcVar13,
               pMVar9->name);
LAB_00133347:
    pcVar13 = "wrong number of call/unspec operands";
LAB_0013334e:
    MVar14 = MIR_ops_num_error;
  } while( true );
}

Assistant:

void MIR_append_insn (MIR_context_t ctx, MIR_item_t func_item, MIR_insn_t insn) {
  mir_assert (func_item != NULL);
  if (func_item->item_type != MIR_func_item)
    MIR_get_error_func (ctx) (MIR_wrong_param_value_error, "MIR_append_insn: wrong func item");
  DLIST_APPEND (MIR_insn_t, func_item->u.func->insns, insn);
}